

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ryml_all.hpp
# Opt level: O0

void __thiscall
c4::yml::
Emitter<c4::yml::WriterOStream<std::__cxx11::basic_ostringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
::_write_scalar_json
          (Emitter<c4::yml::WriterOStream<std::__cxx11::basic_ostringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           *this,csubstr s,bool as_key,bool use_quotes)

{
  basic_ostringstream<char,_std::char_traits<char>,_std::allocator<char>_> bVar1;
  csubstr sp;
  csubstr sp_00;
  csubstr sp_01;
  csubstr sp_02;
  csubstr sp_03;
  csubstr sp_04;
  csubstr sp_05;
  csubstr sp_06;
  csubstr sp_07;
  bool bVar2;
  int iVar3;
  error_flags eVar4;
  size_t sVar5;
  byte in_CL;
  basic_substring<const_char> *in_RDX;
  basic_ostringstream<char,_std::char_traits<char>,_std::allocator<char>_> *in_RSI;
  byte in_R8B;
  csubstr sub;
  size_t i;
  size_t pos;
  undefined7 in_stack_fffffffffffffb28;
  char in_stack_fffffffffffffb2f;
  undefined4 in_stack_fffffffffffffb30;
  error_flags in_stack_fffffffffffffb34;
  WriterOStream<std::__cxx11::basic_ostringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *in_stack_fffffffffffffb38;
  WriterOStream<std::__cxx11::basic_ostringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *this_00;
  undefined4 in_stack_fffffffffffffb40;
  error_flags in_stack_fffffffffffffb44;
  undefined4 in_stack_fffffffffffffb48;
  error_flags in_stack_fffffffffffffb4c;
  basic_substring<const_char> *in_stack_fffffffffffffb50;
  basic_substring<const_char> *local_488;
  undefined4 in_stack_fffffffffffffb98;
  undefined4 in_stack_fffffffffffffb9c;
  char *in_stack_fffffffffffffba0;
  basic_substring<const_char> *pbVar6;
  undefined4 in_stack_fffffffffffffba8;
  undefined4 in_stack_fffffffffffffbac;
  undefined4 in_stack_fffffffffffffbb8;
  undefined4 in_stack_fffffffffffffbbc;
  basic_substring<const_char> *local_438;
  basic_substring<const_char> *local_410;
  basic_substring<const_char> *local_3e8;
  basic_substring<const_char> *local_3c0;
  basic_substring<const_char> *local_308;
  basic_substring<const_char> *local_300;
  WriterOStream<std::__cxx11::basic_ostringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_2d8;
  char *local_2c8;
  undefined4 local_2c0;
  basic_substring<const_char> *local_2b8;
  WriterOStream<std::__cxx11::basic_ostringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *local_2b0;
  char *local_298;
  undefined4 local_290;
  char *local_288;
  undefined4 local_280;
  char *local_278;
  undefined4 local_270;
  basic_substring<const_char> *local_268;
  basic_substring<const_char> *local_260;
  WriterOStream<std::__cxx11::basic_ostringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *local_258;
  char *local_240;
  undefined4 local_238;
  char *local_230;
  undefined4 local_228;
  char *local_220;
  undefined4 local_218;
  basic_substring<const_char> *local_210;
  basic_substring<const_char> *local_208;
  WriterOStream<std::__cxx11::basic_ostringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *local_200;
  char *local_1e8;
  undefined4 local_1e0;
  char *local_1d8;
  undefined4 local_1d0;
  char *local_1c8;
  undefined4 local_1c0;
  basic_substring<const_char> *local_1b8;
  basic_substring<const_char> *local_1b0;
  WriterOStream<std::__cxx11::basic_ostringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *local_1a8;
  char *local_190;
  undefined4 local_188;
  char *local_180;
  undefined4 local_178;
  char *local_170;
  undefined4 local_168;
  basic_substring<const_char> *local_160;
  basic_substring<const_char> *local_158;
  WriterOStream<std::__cxx11::basic_ostringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *local_150;
  char *local_138;
  undefined4 local_130;
  char *local_128;
  undefined4 local_120;
  char *local_118;
  undefined4 local_110;
  basic_substring<const_char> *local_108;
  basic_substring<const_char> *local_100;
  WriterOStream<std::__cxx11::basic_ostringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *local_f8;
  char *local_e0;
  undefined4 local_d8;
  char *local_d0;
  undefined4 local_c8;
  char *local_c0;
  undefined4 local_b8;
  basic_substring<const_char> *local_b0;
  basic_substring<const_char> *local_a8;
  WriterOStream<std::__cxx11::basic_ostringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *local_a0;
  char *local_88;
  undefined4 local_80;
  char *local_78;
  undefined4 local_70;
  char *local_68;
  undefined4 local_60;
  basic_substring<const_char> *local_58;
  basic_substring<const_char> *local_50;
  WriterOStream<std::__cxx11::basic_ostringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *local_48;
  char *local_30;
  WriterOStream<std::__cxx11::basic_ostringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *local_28;
  char *local_20;
  WriterOStream<std::__cxx11::basic_ostringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *local_18;
  char *local_10;
  WriterOStream<std::__cxx11::basic_ostringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *local_8;
  
  local_2d8.m_stream = in_RSI;
  local_2d8.m_pos = (size_t)in_RDX;
  if (((in_R8B & 1) == 0) && ((in_CL & 1) == 0)) {
    local_18 = &local_2d8;
    local_20 = "true";
    iVar3 = basic_substring<const_char>::compare
                      ((basic_substring<const_char> *)
                       CONCAT44(in_stack_fffffffffffffbac,in_stack_fffffffffffffba8),
                       in_stack_fffffffffffffba0,
                       CONCAT44(in_stack_fffffffffffffb9c,in_stack_fffffffffffffb98));
    if (iVar3 != 0) {
      local_8 = &local_2d8;
      local_10 = "false";
      iVar3 = basic_substring<const_char>::compare
                        ((basic_substring<const_char> *)
                         CONCAT44(in_stack_fffffffffffffbac,in_stack_fffffffffffffba8),
                         in_stack_fffffffffffffba0,
                         CONCAT44(in_stack_fffffffffffffb9c,in_stack_fffffffffffffb98));
      if (iVar3 != 0) {
        local_28 = &local_2d8;
        local_30 = "null";
        iVar3 = basic_substring<const_char>::compare
                          ((basic_substring<const_char> *)
                           CONCAT44(in_stack_fffffffffffffbac,in_stack_fffffffffffffba8),
                           in_stack_fffffffffffffba0,
                           CONCAT44(in_stack_fffffffffffffb9c,in_stack_fffffffffffffb98));
        if ((iVar3 != 0) &&
           ((bVar2 = basic_substring<const_char>::is_number
                               ((basic_substring<const_char> *)
                                CONCAT44(in_stack_fffffffffffffbbc,in_stack_fffffffffffffbb8)),
            !bVar2 || ((((basic_substring<const_char> *)0x1 < local_2d8.m_pos &&
                        (bVar2 = basic_substring<const_char>::begins_with
                                           ((basic_substring<const_char> *)&local_2d8,'0'), bVar2))
                       && (sVar5 = basic_substring<const_char>::find
                                             ((basic_substring<const_char> *)
                                              CONCAT44(in_stack_fffffffffffffb34,
                                                       in_stack_fffffffffffffb30),
                                              in_stack_fffffffffffffb2f,0x340602),
                          sVar5 == 0xffffffffffffffff)))))) goto LAB_0034064a;
      }
    }
    sp.str._4_4_ = in_stack_fffffffffffffb44;
    sp.str._0_4_ = in_stack_fffffffffffffb40;
    sp.len._0_4_ = in_stack_fffffffffffffb48;
    sp.len._4_4_ = in_stack_fffffffffffffb4c;
    WriterOStream<std::__cxx11::basic_ostringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::_do_write(in_stack_fffffffffffffb38,sp);
  }
  else {
LAB_0034064a:
    local_300 = (basic_substring<const_char> *)0x0;
    WriterOStream<std::__cxx11::basic_ostringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::_do_write((WriterOStream<std::__cxx11::basic_ostringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                 *)CONCAT44(in_stack_fffffffffffffb34,in_stack_fffffffffffffb30),
                in_stack_fffffffffffffb2f);
    for (local_308 = (basic_substring<const_char> *)0x0; local_308 < local_2d8.m_pos;
        local_308 = (basic_substring<const_char> *)((long)&local_308->str + 1)) {
      bVar1 = local_2d8.m_stream[(long)local_308];
      if (bVar1 == (basic_ostringstream<char,_std::char_traits<char>,_std::allocator<char>_>)0x8) {
        local_200 = &local_2d8;
        local_208 = local_300;
        local_210 = local_308;
        if (local_2d8.m_pos < local_300) {
          eVar4 = get_error_flags();
          if (((eVar4 & 1) != 0) && (bVar2 = is_debugger_attached(), bVar2)) {
            trap_instruction();
          }
          local_220 = 
          "/workspace/llm4binary/github/license_c_cmakelists/google[P]jsonnet/third_party/rapidyaml/ryml_all.hpp"
          ;
          local_218 = 0x1544;
          handle_error(0x3fa1ef,(char *)0x1544,"check failed: %s","first >= 0 && first <= len");
        }
        if (local_210 == (basic_substring<const_char> *)0xffffffffffffffff) {
          local_488 = (basic_substring<const_char> *)local_2d8.m_pos;
        }
        else {
          local_488 = local_210;
        }
        local_210 = local_488;
        if (local_488 < local_208) {
          eVar4 = get_error_flags();
          if (((eVar4 & 1) != 0) && (bVar2 = is_debugger_attached(), bVar2)) {
            trap_instruction();
          }
          local_230 = 
          "/workspace/llm4binary/github/license_c_cmakelists/google[P]jsonnet/third_party/rapidyaml/ryml_all.hpp"
          ;
          local_228 = 0x1546;
          handle_error(0x3fa1ef,(char *)0x1546,"check failed: %s","first <= last");
        }
        if (local_2d8.m_pos < local_210) {
          eVar4 = get_error_flags();
          if (((eVar4 & 1) != 0) && (bVar2 = is_debugger_attached(), bVar2)) {
            trap_instruction();
          }
          local_240 = 
          "/workspace/llm4binary/github/license_c_cmakelists/google[P]jsonnet/third_party/rapidyaml/ryml_all.hpp"
          ;
          local_238 = 0x1547;
          handle_error(0x3fa1ef,(char *)0x1547,"check failed: %s","last >= 0 && last <= len");
        }
        basic_substring<const_char>::basic_substring
                  (in_stack_fffffffffffffb50,
                   (char *)CONCAT44(in_stack_fffffffffffffb4c,in_stack_fffffffffffffb48),
                   CONCAT44(in_stack_fffffffffffffb44,in_stack_fffffffffffffb40));
        sp_05.str._4_4_ = in_stack_fffffffffffffb44;
        sp_05.str._0_4_ = in_stack_fffffffffffffb40;
        sp_05.len._0_4_ = in_stack_fffffffffffffb48;
        sp_05.len._4_4_ = in_stack_fffffffffffffb4c;
        WriterOStream<std::__cxx11::basic_ostringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::_do_write(in_stack_fffffffffffffb38,sp_05);
        WriterOStream<std::__cxx11::ostringstream>::_do_write<3ul>
                  ((WriterOStream<std::__cxx11::basic_ostringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    *)CONCAT44(in_stack_fffffffffffffb34,in_stack_fffffffffffffb30),
                   (char (*) [3])CONCAT17(in_stack_fffffffffffffb2f,in_stack_fffffffffffffb28));
        local_300 = (basic_substring<const_char> *)((long)&local_308->str + 1);
      }
      else if (bVar1 == (basic_ostringstream<char,_std::char_traits<char>,_std::allocator<char>_>)
                        0x9) {
        local_f8 = &local_2d8;
        local_100 = local_300;
        local_108 = local_308;
        if (local_2d8.m_pos < local_300) {
          eVar4 = get_error_flags();
          if (((eVar4 & 1) != 0) && (bVar2 = is_debugger_attached(), bVar2)) {
            trap_instruction();
          }
          local_118 = 
          "/workspace/llm4binary/github/license_c_cmakelists/google[P]jsonnet/third_party/rapidyaml/ryml_all.hpp"
          ;
          local_110 = 0x1544;
          handle_error(0x3fa1ef,(char *)0x1544,"check failed: %s","first >= 0 && first <= len");
        }
        if (local_108 == (basic_substring<const_char> *)0xffffffffffffffff) {
          local_410 = (basic_substring<const_char> *)local_2d8.m_pos;
        }
        else {
          local_410 = local_108;
        }
        local_108 = local_410;
        if (local_410 < local_100) {
          eVar4 = get_error_flags();
          if (((eVar4 & 1) != 0) && (bVar2 = is_debugger_attached(), bVar2)) {
            trap_instruction();
          }
          local_128 = 
          "/workspace/llm4binary/github/license_c_cmakelists/google[P]jsonnet/third_party/rapidyaml/ryml_all.hpp"
          ;
          local_120 = 0x1546;
          handle_error(0x3fa1ef,(char *)0x1546,"check failed: %s","first <= last");
        }
        if (local_2d8.m_pos < local_108) {
          eVar4 = get_error_flags();
          if (((eVar4 & 1) != 0) && (bVar2 = is_debugger_attached(), bVar2)) {
            trap_instruction();
          }
          local_138 = 
          "/workspace/llm4binary/github/license_c_cmakelists/google[P]jsonnet/third_party/rapidyaml/ryml_all.hpp"
          ;
          local_130 = 0x1547;
          handle_error(0x3fa1ef,(char *)0x1547,"check failed: %s","last >= 0 && last <= len");
        }
        basic_substring<const_char>::basic_substring
                  (in_stack_fffffffffffffb50,
                   (char *)CONCAT44(in_stack_fffffffffffffb4c,in_stack_fffffffffffffb48),
                   CONCAT44(in_stack_fffffffffffffb44,in_stack_fffffffffffffb40));
        sp_02.str._4_4_ = in_stack_fffffffffffffb44;
        sp_02.str._0_4_ = in_stack_fffffffffffffb40;
        sp_02.len._0_4_ = in_stack_fffffffffffffb48;
        sp_02.len._4_4_ = in_stack_fffffffffffffb4c;
        WriterOStream<std::__cxx11::basic_ostringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::_do_write(in_stack_fffffffffffffb38,sp_02);
        WriterOStream<std::__cxx11::ostringstream>::_do_write<3ul>
                  ((WriterOStream<std::__cxx11::basic_ostringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    *)CONCAT44(in_stack_fffffffffffffb34,in_stack_fffffffffffffb30),
                   (char (*) [3])CONCAT17(in_stack_fffffffffffffb2f,in_stack_fffffffffffffb28));
        local_300 = (basic_substring<const_char> *)((long)&local_308->str + 1);
      }
      else if (bVar1 == (basic_ostringstream<char,_std::char_traits<char>,_std::allocator<char>_>)
                        0xa) {
        local_a0 = &local_2d8;
        local_a8 = local_300;
        local_b0 = local_308;
        if (local_2d8.m_pos < local_300) {
          eVar4 = get_error_flags();
          if (((eVar4 & 1) != 0) && (bVar2 = is_debugger_attached(), bVar2)) {
            trap_instruction();
          }
          local_c0 = 
          "/workspace/llm4binary/github/license_c_cmakelists/google[P]jsonnet/third_party/rapidyaml/ryml_all.hpp"
          ;
          local_b8 = 0x1544;
          handle_error(0x3fa1ef,(char *)0x1544,"check failed: %s","first >= 0 && first <= len");
        }
        if (local_b0 == (basic_substring<const_char> *)0xffffffffffffffff) {
          local_3e8 = (basic_substring<const_char> *)local_2d8.m_pos;
        }
        else {
          local_3e8 = local_b0;
        }
        local_b0 = local_3e8;
        if (local_3e8 < local_a8) {
          eVar4 = get_error_flags();
          if (((eVar4 & 1) != 0) && (bVar2 = is_debugger_attached(), bVar2)) {
            trap_instruction();
          }
          local_d0 = 
          "/workspace/llm4binary/github/license_c_cmakelists/google[P]jsonnet/third_party/rapidyaml/ryml_all.hpp"
          ;
          local_c8 = 0x1546;
          handle_error(0x3fa1ef,(char *)0x1546,"check failed: %s","first <= last");
        }
        if (local_2d8.m_pos < local_b0) {
          eVar4 = get_error_flags();
          if (((eVar4 & 1) != 0) && (bVar2 = is_debugger_attached(), bVar2)) {
            trap_instruction();
          }
          local_e0 = 
          "/workspace/llm4binary/github/license_c_cmakelists/google[P]jsonnet/third_party/rapidyaml/ryml_all.hpp"
          ;
          local_d8 = 0x1547;
          handle_error(0x3fa1ef,(char *)0x1547,"check failed: %s","last >= 0 && last <= len");
        }
        basic_substring<const_char>::basic_substring
                  (in_stack_fffffffffffffb50,
                   (char *)CONCAT44(in_stack_fffffffffffffb4c,in_stack_fffffffffffffb48),
                   CONCAT44(in_stack_fffffffffffffb44,in_stack_fffffffffffffb40));
        sp_01.str._4_4_ = in_stack_fffffffffffffb44;
        sp_01.str._0_4_ = in_stack_fffffffffffffb40;
        sp_01.len._0_4_ = in_stack_fffffffffffffb48;
        sp_01.len._4_4_ = in_stack_fffffffffffffb4c;
        WriterOStream<std::__cxx11::basic_ostringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::_do_write(in_stack_fffffffffffffb38,sp_01);
        WriterOStream<std::__cxx11::ostringstream>::_do_write<3ul>
                  ((WriterOStream<std::__cxx11::basic_ostringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    *)CONCAT44(in_stack_fffffffffffffb34,in_stack_fffffffffffffb30),
                   (char (*) [3])CONCAT17(in_stack_fffffffffffffb2f,in_stack_fffffffffffffb28));
        local_300 = (basic_substring<const_char> *)((long)&local_308->str + 1);
      }
      else if (bVar1 == (basic_ostringstream<char,_std::char_traits<char>,_std::allocator<char>_>)
                        0xc) {
        local_258 = &local_2d8;
        local_260 = local_300;
        local_268 = local_308;
        if (local_2d8.m_pos < local_300) {
          eVar4 = get_error_flags();
          if (((eVar4 & 1) != 0) && (bVar2 = is_debugger_attached(), bVar2)) {
            trap_instruction();
          }
          local_278 = 
          "/workspace/llm4binary/github/license_c_cmakelists/google[P]jsonnet/third_party/rapidyaml/ryml_all.hpp"
          ;
          local_270 = 0x1544;
          handle_error(0x3fa1ef,(char *)0x1544,"check failed: %s","first >= 0 && first <= len");
        }
        in_stack_fffffffffffffb50 = (basic_substring<const_char> *)local_2d8.m_pos;
        if (local_268 != (basic_substring<const_char> *)0xffffffffffffffff) {
          in_stack_fffffffffffffb50 = local_268;
        }
        local_268 = in_stack_fffffffffffffb50;
        if (in_stack_fffffffffffffb50 < local_260) {
          in_stack_fffffffffffffb4c = get_error_flags();
          if ((in_stack_fffffffffffffb4c & 1) != 0) {
            bVar2 = is_debugger_attached();
            in_stack_fffffffffffffb48 = CONCAT13(bVar2,(int3)in_stack_fffffffffffffb48);
            if (bVar2) {
              trap_instruction();
            }
          }
          local_288 = 
          "/workspace/llm4binary/github/license_c_cmakelists/google[P]jsonnet/third_party/rapidyaml/ryml_all.hpp"
          ;
          local_280 = 0x1546;
          handle_error(0x3fa1ef,(char *)0x1546,"check failed: %s","first <= last");
        }
        if (local_2d8.m_pos < local_268) {
          in_stack_fffffffffffffb44 = get_error_flags();
          if ((in_stack_fffffffffffffb44 & 1) != 0) {
            bVar2 = is_debugger_attached();
            in_stack_fffffffffffffb40 = CONCAT13(bVar2,(int3)in_stack_fffffffffffffb40);
            if (bVar2) {
              trap_instruction();
            }
          }
          local_298 = 
          "/workspace/llm4binary/github/license_c_cmakelists/google[P]jsonnet/third_party/rapidyaml/ryml_all.hpp"
          ;
          local_290 = 0x1547;
          handle_error(0x3fa1ef,(char *)0x1547,"check failed: %s","last >= 0 && last <= len");
        }
        basic_substring<const_char>::basic_substring
                  (in_stack_fffffffffffffb50,
                   (char *)CONCAT44(in_stack_fffffffffffffb4c,in_stack_fffffffffffffb48),
                   CONCAT44(in_stack_fffffffffffffb44,in_stack_fffffffffffffb40));
        sp_06.str._4_4_ = in_stack_fffffffffffffb44;
        sp_06.str._0_4_ = in_stack_fffffffffffffb40;
        sp_06.len._0_4_ = in_stack_fffffffffffffb48;
        sp_06.len._4_4_ = in_stack_fffffffffffffb4c;
        WriterOStream<std::__cxx11::basic_ostringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::_do_write(in_stack_fffffffffffffb38,sp_06);
        WriterOStream<std::__cxx11::ostringstream>::_do_write<3ul>
                  ((WriterOStream<std::__cxx11::basic_ostringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    *)CONCAT44(in_stack_fffffffffffffb34,in_stack_fffffffffffffb30),
                   (char (*) [3])CONCAT17(in_stack_fffffffffffffb2f,in_stack_fffffffffffffb28));
        local_300 = (basic_substring<const_char> *)((long)&local_308->str + 1);
      }
      else if (bVar1 == (basic_ostringstream<char,_std::char_traits<char>,_std::allocator<char>_>)
                        0xd) {
        local_1a8 = &local_2d8;
        local_1b0 = local_300;
        local_1b8 = local_308;
        if (local_2d8.m_pos < local_300) {
          eVar4 = get_error_flags();
          if (((eVar4 & 1) != 0) && (bVar2 = is_debugger_attached(), bVar2)) {
            trap_instruction();
          }
          local_1c8 = 
          "/workspace/llm4binary/github/license_c_cmakelists/google[P]jsonnet/third_party/rapidyaml/ryml_all.hpp"
          ;
          local_1c0 = 0x1544;
          handle_error(0x3fa1ef,(char *)0x1544,"check failed: %s","first >= 0 && first <= len");
        }
        pbVar6 = (basic_substring<const_char> *)local_2d8.m_pos;
        if (local_1b8 != (basic_substring<const_char> *)0xffffffffffffffff) {
          pbVar6 = local_1b8;
        }
        local_1b8 = pbVar6;
        if (pbVar6 < local_1b0) {
          eVar4 = get_error_flags();
          if (((eVar4 & 1) != 0) && (bVar2 = is_debugger_attached(), bVar2)) {
            trap_instruction();
          }
          local_1d8 = 
          "/workspace/llm4binary/github/license_c_cmakelists/google[P]jsonnet/third_party/rapidyaml/ryml_all.hpp"
          ;
          local_1d0 = 0x1546;
          handle_error(0x3fa1ef,(char *)0x1546,"check failed: %s","first <= last");
        }
        if (local_2d8.m_pos < local_1b8) {
          eVar4 = get_error_flags();
          if (((eVar4 & 1) != 0) && (bVar2 = is_debugger_attached(), bVar2)) {
            trap_instruction();
          }
          local_1e8 = 
          "/workspace/llm4binary/github/license_c_cmakelists/google[P]jsonnet/third_party/rapidyaml/ryml_all.hpp"
          ;
          local_1e0 = 0x1547;
          handle_error(0x3fa1ef,(char *)0x1547,"check failed: %s","last >= 0 && last <= len");
        }
        basic_substring<const_char>::basic_substring
                  (in_stack_fffffffffffffb50,
                   (char *)CONCAT44(in_stack_fffffffffffffb4c,in_stack_fffffffffffffb48),
                   CONCAT44(in_stack_fffffffffffffb44,in_stack_fffffffffffffb40));
        sp_04.str._4_4_ = in_stack_fffffffffffffb44;
        sp_04.str._0_4_ = in_stack_fffffffffffffb40;
        sp_04.len._0_4_ = in_stack_fffffffffffffb48;
        sp_04.len._4_4_ = in_stack_fffffffffffffb4c;
        WriterOStream<std::__cxx11::basic_ostringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::_do_write(in_stack_fffffffffffffb38,sp_04);
        WriterOStream<std::__cxx11::ostringstream>::_do_write<3ul>
                  ((WriterOStream<std::__cxx11::basic_ostringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    *)CONCAT44(in_stack_fffffffffffffb34,in_stack_fffffffffffffb30),
                   (char (*) [3])CONCAT17(in_stack_fffffffffffffb2f,in_stack_fffffffffffffb28));
        local_300 = (basic_substring<const_char> *)((long)&local_308->str + 1);
      }
      else if (bVar1 == (basic_ostringstream<char,_std::char_traits<char>,_std::allocator<char>_>)
                        0x22) {
        local_48 = &local_2d8;
        local_50 = local_300;
        local_58 = local_308;
        if (local_2d8.m_pos < local_300) {
          eVar4 = get_error_flags();
          if (((eVar4 & 1) != 0) && (bVar2 = is_debugger_attached(), bVar2)) {
            trap_instruction();
          }
          local_68 = 
          "/workspace/llm4binary/github/license_c_cmakelists/google[P]jsonnet/third_party/rapidyaml/ryml_all.hpp"
          ;
          local_60 = 0x1544;
          handle_error(0x3fa1ef,(char *)0x1544,"check failed: %s","first >= 0 && first <= len");
        }
        if (local_58 == (basic_substring<const_char> *)0xffffffffffffffff) {
          local_3c0 = (basic_substring<const_char> *)local_2d8.m_pos;
        }
        else {
          local_3c0 = local_58;
        }
        local_58 = local_3c0;
        if (local_3c0 < local_50) {
          eVar4 = get_error_flags();
          if (((eVar4 & 1) != 0) && (bVar2 = is_debugger_attached(), bVar2)) {
            trap_instruction();
          }
          local_78 = 
          "/workspace/llm4binary/github/license_c_cmakelists/google[P]jsonnet/third_party/rapidyaml/ryml_all.hpp"
          ;
          local_70 = 0x1546;
          handle_error(0x3fa1ef,(char *)0x1546,"check failed: %s","first <= last");
        }
        if (local_2d8.m_pos < local_58) {
          eVar4 = get_error_flags();
          if (((eVar4 & 1) != 0) && (bVar2 = is_debugger_attached(), bVar2)) {
            trap_instruction();
          }
          local_88 = 
          "/workspace/llm4binary/github/license_c_cmakelists/google[P]jsonnet/third_party/rapidyaml/ryml_all.hpp"
          ;
          local_80 = 0x1547;
          handle_error(0x3fa1ef,(char *)0x1547,"check failed: %s","last >= 0 && last <= len");
        }
        basic_substring<const_char>::basic_substring
                  (in_stack_fffffffffffffb50,
                   (char *)CONCAT44(in_stack_fffffffffffffb4c,in_stack_fffffffffffffb48),
                   CONCAT44(in_stack_fffffffffffffb44,in_stack_fffffffffffffb40));
        sp_00.str._4_4_ = in_stack_fffffffffffffb44;
        sp_00.str._0_4_ = in_stack_fffffffffffffb40;
        sp_00.len._0_4_ = in_stack_fffffffffffffb48;
        sp_00.len._4_4_ = in_stack_fffffffffffffb4c;
        WriterOStream<std::__cxx11::basic_ostringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::_do_write(in_stack_fffffffffffffb38,sp_00);
        WriterOStream<std::__cxx11::ostringstream>::_do_write<3ul>
                  ((WriterOStream<std::__cxx11::basic_ostringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    *)CONCAT44(in_stack_fffffffffffffb34,in_stack_fffffffffffffb30),
                   (char (*) [3])CONCAT17(in_stack_fffffffffffffb2f,in_stack_fffffffffffffb28));
        local_300 = (basic_substring<const_char> *)((long)&local_308->str + 1);
      }
      else if (bVar1 == (basic_ostringstream<char,_std::char_traits<char>,_std::allocator<char>_>)
                        0x5c) {
        local_150 = &local_2d8;
        local_158 = local_300;
        local_160 = local_308;
        if (local_2d8.m_pos < local_300) {
          eVar4 = get_error_flags();
          if (((eVar4 & 1) != 0) && (bVar2 = is_debugger_attached(), bVar2)) {
            trap_instruction();
          }
          local_170 = 
          "/workspace/llm4binary/github/license_c_cmakelists/google[P]jsonnet/third_party/rapidyaml/ryml_all.hpp"
          ;
          local_168 = 0x1544;
          handle_error(0x3fa1ef,(char *)0x1544,"check failed: %s","first >= 0 && first <= len");
        }
        if (local_160 == (basic_substring<const_char> *)0xffffffffffffffff) {
          local_438 = (basic_substring<const_char> *)local_2d8.m_pos;
        }
        else {
          local_438 = local_160;
        }
        local_160 = local_438;
        if (local_438 < local_158) {
          eVar4 = get_error_flags();
          if (((eVar4 & 1) != 0) && (bVar2 = is_debugger_attached(), bVar2)) {
            trap_instruction();
          }
          local_180 = 
          "/workspace/llm4binary/github/license_c_cmakelists/google[P]jsonnet/third_party/rapidyaml/ryml_all.hpp"
          ;
          local_178 = 0x1546;
          handle_error(0x3fa1ef,(char *)0x1546,"check failed: %s","first <= last");
        }
        if (local_2d8.m_pos < local_160) {
          eVar4 = get_error_flags();
          if (((eVar4 & 1) != 0) && (bVar2 = is_debugger_attached(), bVar2)) {
            trap_instruction();
          }
          local_190 = 
          "/workspace/llm4binary/github/license_c_cmakelists/google[P]jsonnet/third_party/rapidyaml/ryml_all.hpp"
          ;
          local_188 = 0x1547;
          handle_error(0x3fa1ef,(char *)0x1547,"check failed: %s","last >= 0 && last <= len");
        }
        basic_substring<const_char>::basic_substring
                  (in_stack_fffffffffffffb50,
                   (char *)CONCAT44(in_stack_fffffffffffffb4c,in_stack_fffffffffffffb48),
                   CONCAT44(in_stack_fffffffffffffb44,in_stack_fffffffffffffb40));
        sp_03.str._4_4_ = in_stack_fffffffffffffb44;
        sp_03.str._0_4_ = in_stack_fffffffffffffb40;
        sp_03.len._0_4_ = in_stack_fffffffffffffb48;
        sp_03.len._4_4_ = in_stack_fffffffffffffb4c;
        WriterOStream<std::__cxx11::basic_ostringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::_do_write(in_stack_fffffffffffffb38,sp_03);
        WriterOStream<std::__cxx11::ostringstream>::_do_write<3ul>
                  ((WriterOStream<std::__cxx11::basic_ostringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    *)CONCAT44(in_stack_fffffffffffffb34,in_stack_fffffffffffffb30),
                   (char (*) [3])CONCAT17(in_stack_fffffffffffffb2f,in_stack_fffffffffffffb28));
        local_300 = (basic_substring<const_char> *)((long)&local_308->str + 1);
      }
    }
    if (local_300 < local_2d8.m_pos) {
      this_00 = &local_2d8;
      local_2b8 = local_300;
      local_2b0 = this_00;
      if (local_2d8.m_pos < local_300) {
        in_stack_fffffffffffffb34 = get_error_flags();
        if ((in_stack_fffffffffffffb34 & 1) != 0) {
          bVar2 = is_debugger_attached();
          in_stack_fffffffffffffb30 = CONCAT13(bVar2,(int3)in_stack_fffffffffffffb30);
          if (bVar2) {
            trap_instruction();
          }
        }
        local_2c8 = 
        "/workspace/llm4binary/github/license_c_cmakelists/google[P]jsonnet/third_party/rapidyaml/ryml_all.hpp"
        ;
        local_2c0 = 0x1533;
        handle_error(0x3fa1ef,(char *)0x1533,"check failed: %s","first >= 0 && first <= len");
      }
      basic_substring<const_char>::basic_substring
                (in_stack_fffffffffffffb50,
                 (char *)CONCAT44(in_stack_fffffffffffffb4c,in_stack_fffffffffffffb48),
                 CONCAT44(in_stack_fffffffffffffb44,in_stack_fffffffffffffb40));
      sp_07.str._4_4_ = in_stack_fffffffffffffb44;
      sp_07.str._0_4_ = in_stack_fffffffffffffb40;
      sp_07.len._0_4_ = in_stack_fffffffffffffb48;
      sp_07.len._4_4_ = in_stack_fffffffffffffb4c;
      WriterOStream<std::__cxx11::basic_ostringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::_do_write(this_00,sp_07);
    }
    WriterOStream<std::__cxx11::basic_ostringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::_do_write((WriterOStream<std::__cxx11::basic_ostringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                 *)CONCAT44(in_stack_fffffffffffffb34,in_stack_fffffffffffffb30),
                in_stack_fffffffffffffb2f);
  }
  return;
}

Assistant:

void Emitter<Writer>::_write_scalar_json(csubstr s, bool as_key, bool use_quotes)
{
    if((!use_quotes)
       // json keys require quotes
       && (!as_key)
       && (
           // do not quote special cases
           (s == "true" || s == "false" || s == "null")
           || (
               // do not quote numbers
               (s.is_number()
                && (
                    // quote integral numbers if they have a leading 0
                    // https://github.com/biojppm/rapidyaml/issues/291
                    (!(s.len > 1 && s.begins_with('0')))
                    // do not quote reals with leading 0
                    // https://github.com/biojppm/rapidyaml/issues/313
                    || (s.find('.') != csubstr::npos) ))
               )
           )
        )
    {
        this->Writer::_do_write(s);
    }
    else
    {
        size_t pos = 0;
        this->Writer::_do_write('"');
        for(size_t i = 0; i < s.len; ++i)
        {
            switch(s.str[i])
            {
            case '"':
              this->Writer ::_do_write(s.range(pos, i));
              this->Writer ::_do_write("\\\"");
              pos = i + 1;
              break;
            case '\n':
              this->Writer ::_do_write(s.range(pos, i));
              this->Writer ::_do_write("\\n");
              pos = i + 1;
              break;
            case '\t':
              this->Writer ::_do_write(s.range(pos, i));
              this->Writer ::_do_write("\\t");
              pos = i + 1;
              break;
            case '\\':
              this->Writer ::_do_write(s.range(pos, i));
              this->Writer ::_do_write("\\\\");
              pos = i + 1;
              break;
            case '\r':
              this->Writer ::_do_write(s.range(pos, i));
              this->Writer ::_do_write("\\r");
              pos = i + 1;
              break;
            case '\b':
              this->Writer ::_do_write(s.range(pos, i));
              this->Writer ::_do_write("\\b");
              pos = i + 1;
              break;
            case '\f':
              this->Writer ::_do_write(s.range(pos, i));
              this->Writer ::_do_write("\\f");
              pos = i + 1;
              break;
            }
        }
        if(pos < s.len)
        {
            csubstr sub = s.sub(pos);
            this->Writer::_do_write(sub);
        }
        this->Writer::_do_write('"');
    }
}